

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O3

void __thiscall
SemanticAnalyzerRun::onExitFunctionDeclarationExpressionAstNode
          (SemanticAnalyzerRun *this,FunctionDeclarationExpressionAstNode *node)

{
  size_t sVar1;
  iterator iVar2;
  FunctionDeclarationExpressionAstNode *local_48;
  FunctionDeclarationExpressionAstNode *node_local;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  sVar1 = this->functionDept;
  local_48 = node;
  node_local = (FunctionDeclarationExpressionAstNode *)&local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&node_local,
             "Expected a non zero function dept when calling onExitFunctionDeclarationExpressionAstNode"
             ,"");
  Error::assertWithPanic(sVar1 != 0,(string *)&node_local);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)node_local != &local_30) {
    operator_delete(node_local,local_30._M_allocated_capacity + 1);
  }
  this->functionDept = this->functionDept - 1;
  iVar2 = std::
          _Hashtable<FunctionDeclarationExpressionAstNode_*,_std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>,_std::allocator<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<FunctionDeclarationExpressionAstNode_*>,_std::hash<FunctionDeclarationExpressionAstNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->inLoopState)._M_h,&local_48);
  node_local = (FunctionDeclarationExpressionAstNode *)&local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&node_local,
             "Could not find a key in inLoopState map for function declaration","");
  Error::assertWithPanic
            (iVar2.
             super__Node_iterator_base<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>,_false>
             ._M_cur != (__node_type *)0x0,(string *)&node_local);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)node_local != &local_30) {
    operator_delete(node_local,local_30._M_allocated_capacity + 1);
  }
  this->inLoop = *(bool *)((long)iVar2.
                                 super__Node_iterator_base<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>,_false>
                                 ._M_cur + 0x10);
  popScope(this);
  return;
}

Assistant:

void onExitFunctionDeclarationExpressionAstNode(FunctionDeclarationExpressionAstNode* node) noexcept override {
    Error::assertWithPanic(
      this->functionDept != 0,
      "Expected a non zero function dept when calling onExitFunctionDeclarationExpressionAstNode");

    this->functionDept--;

    auto search = this->inLoopState.find(node);

    Error::assertWithPanic(
      search != this->inLoopState.end(),
      "Could not find a key in inLoopState map for function declaration");

    this->inLoop = search->second;

    this->popScope();
  }